

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  void *pvVar1;
  int iVar2;
  timediff_t tVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  curltime older;
  curltime cVar7;
  curltime newer;
  curltime newer_00;
  curltime t;
  long local_38;
  int iStack_30;
  undefined4 uStack_2c;
  
  pvVar1 = cf->ctx;
  local_38 = 0;
  iStack_30 = 0;
  uStack_2c = 0;
  if (*(char *)((long)pvVar1 + 0x84) == '\x01') {
    plVar5 = *(long **)((long)pvVar1 + 0x60);
  }
  else {
    plVar5 = (long *)0x0;
  }
  if (plVar5 != (long *)0x0) {
    iVar2 = (**(code **)(*plVar5 + 0x68))(plVar5,data,query,0,&local_38);
    lVar6 = 0;
    iVar4 = 0;
    if (iVar2 != 0) goto LAB_00624295;
    newer.tv_usec = iStack_30;
    newer.tv_sec = local_38;
    if (iStack_30 != 0 || local_38 != 0) {
      newer._12_4_ = 0;
      tVar3 = Curl_timediff_us(newer,(curltime)ZEXT816(0));
      lVar6 = 0;
      iVar4 = 0;
      if (0 < tVar3) {
        lVar6 = local_38;
        iVar4 = iStack_30;
      }
      goto LAB_00624295;
    }
  }
  iVar4 = 0;
  lVar6 = 0;
LAB_00624295:
  local_38 = 0;
  iStack_30 = 0;
  uStack_2c = 0;
  if (*(char *)((long)pvVar1 + 0x54) == '\x01') {
    plVar5 = *(long **)((long)pvVar1 + 0x30);
  }
  else {
    plVar5 = (long *)0x0;
  }
  if (plVar5 != (long *)0x0) {
    iVar2 = (**(code **)(*plVar5 + 0x68))(plVar5,data,query,0,&local_38);
    if ((iVar2 == 0) &&
       (newer_00.tv_usec = iStack_30, newer_00.tv_sec = local_38, iStack_30 != 0 || local_38 != 0))
    {
      older.tv_usec = iVar4;
      older.tv_sec = lVar6;
      older._12_4_ = 0;
      newer_00._12_4_ = 0;
      tVar3 = Curl_timediff_us(newer_00,older);
      if (0 < tVar3) {
        lVar6 = local_38;
        iVar4 = iStack_30;
      }
    }
  }
  cVar7.tv_usec = iVar4;
  cVar7.tv_sec = lVar6;
  cVar7._12_4_ = 0;
  return cVar7;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct Curl_cfilter *cfb;
  struct curltime t, tmax;

  memset(&tmax, 0, sizeof(tmax));
  memset(&t, 0, sizeof(t));
  cfb = ctx->h21_baller.enabled? ctx->h21_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  memset(&t, 0, sizeof(t));
  cfb = ctx->h3_baller.enabled? ctx->h3_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  return tmax;
}